

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clara.hpp
# Opt level: O2

BasicResult<clara::detail::ParseState> *
clara::detail::BasicResult<clara::detail::ParseState>::ok<clara::detail::ParseState>
          (BasicResult<clara::detail::ParseState> *__return_storage_ptr__,ParseState *value)

{
  ResultValueBase(__return_storage_ptr__,Ok,value);
  return __return_storage_ptr__;
}

Assistant:

static auto ok( U const &value ) -> BasicResult { return { ResultBase::Ok, value }; }